

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

void * drmp3__realloc_from_callbacks
                 (void *p,size_t szNew,size_t szOld,drmp3_allocation_callbacks *pAllocationCallbacks
                 )

{
  void *p2;
  drmp3_allocation_callbacks *pAllocationCallbacks_local;
  size_t szOld_local;
  size_t szNew_local;
  void *p_local;
  
  if (pAllocationCallbacks == (drmp3_allocation_callbacks *)0x0) {
    p_local = (void *)0x0;
  }
  else if (pAllocationCallbacks->onRealloc == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
    if ((pAllocationCallbacks->onMalloc == (_func_void_ptr_size_t_void_ptr *)0x0) ||
       (pAllocationCallbacks->onFree == (_func_void_void_ptr_void_ptr *)0x0)) {
      p_local = (void *)0x0;
    }
    else {
      p_local = (*pAllocationCallbacks->onMalloc)(szNew,pAllocationCallbacks->pUserData);
      if (p_local == (void *)0x0) {
        p_local = (void *)0x0;
      }
      else if (p != (void *)0x0) {
        (*SDL20_memcpy)(p_local,p,szOld);
        (*pAllocationCallbacks->onFree)(p,pAllocationCallbacks->pUserData);
      }
    }
  }
  else {
    p_local = (*pAllocationCallbacks->onRealloc)(p,szNew,pAllocationCallbacks->pUserData);
  }
  return p_local;
}

Assistant:

static void* drmp3__realloc_from_callbacks(void* p, size_t szNew, size_t szOld, const drmp3_allocation_callbacks* pAllocationCallbacks)
{
    if (pAllocationCallbacks == NULL) {
        return NULL;
    }

    if (pAllocationCallbacks->onRealloc != NULL) {
        return pAllocationCallbacks->onRealloc(p, szNew, pAllocationCallbacks->pUserData);
    }

    /* Try emulating realloc() in terms of malloc()/free(). */
    if (pAllocationCallbacks->onMalloc != NULL && pAllocationCallbacks->onFree != NULL) {
        void* p2;

        p2 = pAllocationCallbacks->onMalloc(szNew, pAllocationCallbacks->pUserData);
        if (p2 == NULL) {
            return NULL;
        }

        if (p != NULL) {
            DRMP3_COPY_MEMORY(p2, p, szOld);
            pAllocationCallbacks->onFree(p, pAllocationCallbacks->pUserData);
        }

        return p2;
    }

    return NULL;
}